

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qxkbcommon.cpp
# Opt level: O3

QList<int> *
QXkbCommon::possibleKeys
          (QList<int> *__return_storage_ptr__,xkb_state *state,QKeyEvent *event,bool superAsMeta,
          bool hyperAsMeta)

{
  iterator iVar1;
  iterator iVar2;
  QList<QKeyCombination> *__range1;
  long in_FS_OFFSET;
  QList<QKeyCombination> local_48;
  int local_2c;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (int *)0x0;
  (__return_storage_ptr__->d).size = 0;
  local_48.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_48.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_48.d.ptr = (QKeyCombination *)&DAT_aaaaaaaaaaaaaaaa;
  possibleKeyCombinations(&local_48,state,event,superAsMeta,hyperAsMeta);
  iVar1 = QList<QKeyCombination>::begin(&local_48);
  iVar2 = QList<QKeyCombination>::end(&local_48);
  if (iVar1.i != iVar2.i) {
    do {
      local_2c = (iVar1.i)->combination;
      QtPrivate::QPodArrayOps<int>::emplace<int&>
                ((QPodArrayOps<int> *)__return_storage_ptr__,(__return_storage_ptr__->d).size,
                 &local_2c);
      QList<int>::end(__return_storage_ptr__);
      iVar1.i = iVar1.i + 1;
    } while (iVar1.i != iVar2.i);
  }
  if (&(local_48.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_48.d.d)->super_QArrayData,4,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QList<int> QXkbCommon::possibleKeys(xkb_state *state, const QKeyEvent *event,
                                    bool superAsMeta, bool hyperAsMeta)
{
    QList<int> result;
    auto keyCombinations = possibleKeyCombinations(state, event, superAsMeta, hyperAsMeta);
    for (auto keyCombination : keyCombinations)
        result << keyCombination.toCombined();

    return result;
}